

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

bool __thiscall DCanvas::ClipBox(DCanvas *this,int *x,int *y,int *w,int *h,BYTE **src,int srcpitch)

{
  BYTE **src_local;
  int *h_local;
  int *w_local;
  int *y_local;
  int *x_local;
  DCanvas *this_local;
  
  if ((((*x < this->Width) && (*y < this->Height)) && (0 < *x + *w)) && (0 < *y + *h)) {
    if (*x < 0) {
      *src = *src + -(long)*x;
      *w = *x + *w;
      *x = 0;
    }
    if (this->Width < *x + *w) {
      *w = this->Width - *x;
    }
    if (*y < 0) {
      *src = *src + -(long)(*y * srcpitch);
      *h = *y + *h;
      *y = 0;
    }
    if (this->Height < *y + *h) {
      *h = this->Height - *y;
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DCanvas::ClipBox (int &x, int &y, int &w, int &h, const BYTE *&src, const int srcpitch) const
{
	if (x >= Width || y >= Height || x+w <= 0 || y+h <= 0)
	{ // Completely clipped off screen
		return true;
	}
	if (x < 0)				// clip left edge
	{
		src -= x;
		w += x;
		x = 0;
	}
	if (x+w > Width)		// clip right edge
	{
		w = Width - x;
	}
	if (y < 0)				// clip top edge
	{
		src -= y*srcpitch;
		h += y;
		y = 0;
	}
	if (y+h > Height)		// clip bottom edge
	{
		h = Height - y;
	}
	return false;
}